

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

void concat(char *s1,char *s2,char *s3)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  string t;
  
  uVar3 = 0xffffffffffffffff;
  do {
    cVar1 = s1[uVar3 + 1];
    t[uVar3 + 1] = cVar1;
    uVar3 = uVar3 + 1;
  } while (cVar1 != '\0');
  uVar2 = uVar3;
  do {
    uVar4 = uVar2;
    cVar1 = s2[uVar4 - (long)(int)uVar3];
    t[uVar4] = cVar1;
    uVar2 = uVar4 + 1;
  } while (cVar1 != '\0');
  t[uVar4] = '\0';
  for (uVar3 = 0; (uVar4 + 1 & 0xffffffff) != uVar3; uVar3 = uVar3 + 1) {
    s3[uVar3] = t[uVar3];
  }
  return;
}

Assistant:

void concat(s1,s2,s3)
string s1, s2, s3 ;

{ string t ;
  int i, j ;

  for (i = 0 ; (t[i] = s1[i]) != '\0' ; i++) ;
  for (j = i ; (t[j] = s2[j - i]) != '\0' ; j++) ;
  t[j] = '\0' ;
  for (i = 0 ; i <= j ; i++) {
    s3[i] = t[i] ;
  }
}